

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this
             ,Dispatch_State *t_ss)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  Type_Conversions *pTVar3;
  long lVar4;
  size_t __n;
  size_t sVar5;
  Dispatch_Engine *pDVar6;
  pointer pcVar7;
  Type_Info t_ti;
  Type_Info t_ti_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  int iVar9;
  int iVar10;
  const_iterator cVar11;
  Dispatch_State *in_RDX;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *extraout_RDX;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *extraout_RDX_00;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *t_node;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  string *t_name;
  Boxed_Value BVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Type_Info type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> guard;
  Param_Types param_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t_param_names;
  undefined1 local_199;
  undefined1 local_198 [16];
  undefined1 local_188 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  undefined1 local_168 [16];
  pointer local_158;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  Dispatch_Engine *local_110;
  Dispatch_State *local_108;
  int local_fc;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f8;
  undefined1 local_e8 [8];
  bool bStack_e0;
  undefined7 uStack_df;
  undefined1 uStack_d8;
  undefined7 uStack_d7;
  bool bStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_a8;
  pointer_____offset_0x10___ *local_98;
  pointer_____offset_0x10___ *ppuStack_90;
  reference_wrapper<chaiscript::parser::ChaiScript_Parser_Base> local_88;
  atomic_uint_fast32_t local_80;
  long local_78;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  
  lVar2 = *(long *)t_ss[2].m_conversions.m_conversions._M_data;
  local_198._0_8_ = (Dispatch_Engine *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"this","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_198;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l,(allocator_type *)local_e8);
  t_node = extraout_RDX;
  if ((Dispatch_Engine *)local_198._0_8_ != (Dispatch_Engine *)local_188) {
    operator_delete((void *)local_198._0_8_,local_188._0_8_ + 1);
    t_node = extraout_RDX_00;
  }
  uStack_d8 = 0;
  uStack_d7 = 0;
  bStack_d0 = false;
  local_e8 = (undefined1  [8])0x0;
  bStack_e0 = false;
  uStack_df = 0;
  pTVar3 = t_ss[2].m_conversions.m_conversions._M_data;
  if ((0x10 < (ulong)((long)t_ss[2].m_conversions.m_saves._M_data - (long)pTVar3)) &&
     (*(int *)(*(long *)&(pTVar3->m_conversions)._M_t._M_impl.super__Rb_tree_header._M_header + 8)
      == 3)) {
    Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::
    get_arg_names_abi_cxx11_
              (&local_130,
               *(Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
                 **)&(pTVar3->m_conversions)._M_t._M_impl.super__Rb_tree_header._M_header,t_node);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c0,
               local_c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               local_130.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_130.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
    get_arg_types((Param_Types *)local_198,
                  *(AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                    **)&((t_ss[2].m_conversions.m_conversions._M_data)->m_conversions)._M_t._M_impl.
                        super__Rb_tree_header._M_header,in_RDX);
    local_168._0_8_ = local_e8;
    local_168._8_8_ = CONCAT71(uStack_df,bStack_e0);
    local_158 = (pointer)CONCAT71(uStack_d7,uStack_d8);
    local_e8 = (undefined1  [8])local_198._0_8_;
    bStack_e0 = SUB81(local_198._8_8_,0);
    uStack_df = SUB87(local_198._8_8_,1);
    uStack_d8 = (undefined1)local_188._0_8_;
    uStack_d7 = SUB87(local_188._0_8_,1);
    local_198._0_8_ = (Dispatch_Engine *)0x0;
    local_198._8_8_ = (pointer)0x0;
    local_188._0_8_ = 0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
               *)local_168);
    bStack_d0 = (bool)local_188[8];
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
               *)local_198);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_130);
  }
  iVar10 = (int)((long)local_c0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_c0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_f8.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_f8.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110 = (in_RDX->m_engine)._M_data;
  if (t_ss[3].m_conversions.m_saves._M_data != (Conversion_Saves *)0x0) {
    local_198._0_8_ = local_110;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_198 + 8),&local_c0);
    local_188._16_8_ = t_ss[3].m_conversions.m_saves._M_data;
    local_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_ss[4].m_engine._M_data;
    if ((Dispatch_Engine *)local_170._M_pi != (Dispatch_Engine *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((Dispatch_Engine *)local_170._M_pi)->m_conversions =
             *(int *)&((Dispatch_Engine *)local_170._M_pi)->m_conversions + 1;
        UNLOCK();
      }
      else {
        *(int *)&((Dispatch_Engine *)local_170._M_pi)->m_conversions =
             *(int *)&((Dispatch_Engine *)local_170._M_pi)->m_conversions + 1;
      }
    }
    local_130.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar10);
    make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_1_>,chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_1_,int,std::shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>const&>
              ((chaiscript *)local_168,(anon_class_48_3_e1829392_for_m_f *)local_198,
               (int *)&local_130,
               (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
                *)&t_ss[3].m_conversions.m_saves);
    _Var8._M_pi = local_f8.
                  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    local_f8.
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
    local_f8.
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_168._0_8_;
    local_168._0_8_ = (Dispatch_Engine *)0x0;
    local_168._8_8_ = (pointer)0x0;
    if ((pointer)_Var8._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    if ((pointer)local_168._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
    }
    if ((Dispatch_Engine *)local_170._M_pi != (Dispatch_Engine *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_198 + 8));
  }
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar2 + 0x10);
  lVar4 = *(long *)&((t_ss[2].m_conversions.m_conversions._M_data)->m_conversions)._M_t._M_impl;
  __n = *(size_t *)(lVar4 + 0x18);
  t_name = (string *)(lVar4 + 0x10);
  sVar5 = *(size_t *)(lVar2 + 0x18);
  local_108 = in_RDX;
  local_c8 = pbVar1;
  local_78 = lVar2;
  if ((__n == sVar5) &&
     ((__n == 0 ||
      (iVar9 = bcmp((t_name->_M_dataplus)._M_p,(pbVar1->_M_dataplus)._M_p,__n), iVar9 == 0)))) {
    pcVar7 = (pbVar1->_M_dataplus)._M_p;
    local_50._M_allocated_capacity = (size_type)(pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar7,pcVar7 + sVar5);
    local_98 = &Type_Info::Unknown_Type::typeinfo;
    ppuStack_90 = &Type_Info::Unknown_Type::typeinfo;
    local_88._M_data = (ChaiScript_Parser_Base *)0x20;
    t_ti.m_bare_type_info = (type_info *)&Type_Info::Unknown_Type::typeinfo;
    t_ti.m_type_info = (type_info *)&Type_Info::Unknown_Type::typeinfo;
    t_ti._16_8_ = 0x20;
    dispatch::Param_Types::push_front((Param_Types *)local_e8,(string *)&local_50,t_ti);
    if ((pointer)local_50._M_allocated_capacity != (pointer)&local_40) {
      operator_delete((void *)local_50._M_allocated_capacity,(ulong)(local_40._M_p + 1));
    }
    pDVar6 = (local_108->m_engine)._M_data;
    local_198._0_8_ = local_110;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_198 + 8),&local_c0);
    local_188._16_8_ = t_ss[3].m_stack_holder._M_data;
    local_170._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_ss[3].m_conversions.m_conversions._M_data
    ;
    if ((Type_Conversions *)local_170._M_pi != (Type_Conversions *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((Type_Conversions *)local_170._M_pi)->m_conversions)._M_t._M_impl =
             *(int *)&(((Type_Conversions *)local_170._M_pi)->m_conversions)._M_t._M_impl + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((Type_Conversions *)local_170._M_pi)->m_conversions)._M_t._M_impl =
             *(int *)&(((Type_Conversions *)local_170._M_pi)->m_conversions)._M_t._M_impl + 1;
      }
    }
    local_a8.
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ._0_4_ = iVar10;
    make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_2_>,chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_2_,int,std::shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>const&,chaiscript::dispatch::Param_Types&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>&>
              ((chaiscript *)&local_140,(anon_class_48_3_baf6a18f_for_m_f *)local_198,
               (int *)&local_a8,
               (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
                *)&t_ss[3].m_stack_holder,(Param_Types *)local_e8,&local_f8);
    local_130.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chaiscript::dispatch::detail::Dynamic_Object_Constructor,std::allocator<chaiscript::dispatch::detail::Dynamic_Object_Constructor>,std::__cxx11::string_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_130.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,(Dynamic_Object_Constructor **)&local_130
               ,(allocator<chaiscript::dispatch::detail::Dynamic_Object_Constructor> *)&local_fc,
               local_c8,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_140);
    local_168._0_8_ =
         local_130.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_168._8_8_ =
         local_130.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_130.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_130.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    chaiscript::detail::Dispatch_Engine::add_function(pDVar6,(Proxy_Function *)local_168,t_name);
    if ((pointer)local_168._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
    }
    local_a8.
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_str;
    if ((_Base_ptr)
        local_130.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_130.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      local_a8.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_str;
    }
  }
  else {
    pDVar6 = (local_108->m_engine)._M_data;
    local_140._M_str = (pbVar1->_M_dataplus)._M_p;
    local_140._M_len = sVar5;
    local_80.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)this;
    cVar11 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Type_Info>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Type_Info>>,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Type_Info>>>
             ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Type_Info>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Type_Info>>,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Type_Info>>>
                         *)&(pDVar6->m_state).m_types,&local_140);
    if ((_Rb_tree_header *)cVar11._M_node ==
        &(pDVar6->m_state).m_types._M_t._M_impl.super__Rb_tree_header) {
      local_168._0_8_ = &Type_Info::Unknown_Type::typeinfo;
      local_168._8_8_ = &Type_Info::Unknown_Type::typeinfo;
      local_158 = (pointer)0x20;
    }
    else {
      local_158 = (pointer)cVar11._M_node[2]._M_left;
      local_168._0_8_ = *(undefined8 *)(cVar11._M_node + 2);
      local_168._8_8_ = cVar11._M_node[2]._M_parent;
    }
    local_70._0_8_ = (pointer)(local_70 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,*(long *)(local_78 + 0x10),
               *(long *)(local_78 + 0x18) + *(long *)(local_78 + 0x10));
    t_ti_00.m_bare_type_info = (type_info *)local_168._8_8_;
    t_ti_00.m_type_info = (type_info *)local_168._0_8_;
    t_ti_00._16_8_ = local_158;
    dispatch::Param_Types::push_front((Param_Types *)local_e8,(string *)local_70,t_ti_00);
    this = (Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
           local_80.super___atomic_base<unsigned_long>._M_i;
    if ((pointer)local_70._0_8_ != (pointer)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
    }
    pDVar6 = (local_108->m_engine)._M_data;
    local_198._0_8_ = local_110;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_198 + 8),&local_c0);
    local_188._16_8_ = t_ss[3].m_stack_holder._M_data;
    local_170._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_ss[3].m_conversions.m_conversions._M_data
    ;
    if ((Type_Conversions *)local_170._M_pi != (Type_Conversions *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((Type_Conversions *)local_170._M_pi)->m_conversions)._M_t._M_impl =
             *(int *)&(((Type_Conversions *)local_170._M_pi)->m_conversions)._M_t._M_impl + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((Type_Conversions *)local_170._M_pi)->m_conversions)._M_t._M_impl =
             *(int *)&(((Type_Conversions *)local_170._M_pi)->m_conversions)._M_t._M_impl + 1;
      }
    }
    local_fc = iVar10;
    make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_3_>,chaiscript::eval::Method_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::Function_Params_const&)_3_,int,std::shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>const&,chaiscript::dispatch::Param_Types&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>&>
              ((chaiscript *)&local_a8,(anon_class_48_3_baf6a18f_for_m_f *)local_198,&local_fc,
               (shared_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
                *)&t_ss[3].m_stack_holder,(Param_Types *)local_e8,&local_f8);
    local_140._M_len = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chaiscript::dispatch::detail::Dynamic_Object_Function,std::allocator<chaiscript::dispatch::detail::Dynamic_Object_Function>,std::__cxx11::string_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,chaiscript::Type_Info&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_140._M_str,
               (Dynamic_Object_Function **)&local_140,
               (allocator<chaiscript::dispatch::detail::Dynamic_Object_Function> *)&local_199,
               local_c8,&local_a8,(Type_Info *)local_168);
    local_130.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_140._M_len;
    local_130.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_140._M_str;
    local_140._M_len = 0;
    local_140._M_str = (char *)0x0;
    chaiscript::detail::Dispatch_Engine::add_function(pDVar6,(Proxy_Function *)&local_130,t_name);
    if ((_Base_ptr)
        local_130.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_130.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((_Base_ptr)local_140._M_str != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_str);
    }
  }
  if ((_Base_ptr)
      local_a8.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((Type_Conversions *)local_170._M_pi != (Type_Conversions *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_198 + 8));
  if ((void_var()::v == '\0') && (iVar10 = __cxa_guard_acquire(&void_var()::v), iVar10 != 0)) {
    Boxed_Value::Boxed_Value<chaiscript::Boxed_Value::Void_Type,void>
              (&void_var::v,(Void_Type *)local_198,false);
    __cxa_atexit(Boxed_Value::~Boxed_Value,&void_var::v,&__dso_handle);
    __cxa_guard_release(&void_var()::v);
  }
  *(element_type **)this =
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var8 = void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)this + 8) =
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var8._M_pi)->_M_use_count = (_Var8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var8._M_pi)->_M_use_count = (_Var8._M_pi)->_M_use_count + 1;
    }
  }
  if ((pointer)local_f8.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
             *)local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX_01._M_pi;
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        AST_Node_Impl_Ptr<T> guardnode;

        const std::string &class_name = this->children[0]->text;

        // The first param of a method is always the implied this ptr.
        std::vector<std::string> t_param_names{"this"};
        dispatch::Param_Types param_types;

        if ((this->children.size() > 2) && (this->children[2]->identifier == AST_Node_Type::Arg_List)) {
          auto args = Arg_List_AST_Node<T>::get_arg_names(*this->children[2]);
          t_param_names.insert(t_param_names.end(), args.begin(), args.end());
          param_types = Arg_List_AST_Node<T>::get_arg_types(*this->children[2], t_ss);
        }

        const size_t numparams = t_param_names.size();

        std::shared_ptr<dispatch::Proxy_Function_Base> guard;
        std::reference_wrapper<chaiscript::detail::Dispatch_Engine> engine(*t_ss);
        if (m_guard_node) {
          guard = dispatch::make_dynamic_proxy_function(
              [engine, t_param_names, guardnode = m_guard_node](const Function_Params &t_params) {
                return chaiscript::eval::detail::eval_function(engine, *guardnode, t_param_names, t_params);
              },
              static_cast<int>(numparams),
              m_guard_node);
        }

        try {
          const std::string &function_name = this->children[1]->text;

          if (function_name == class_name) {
            param_types.push_front(class_name, Type_Info());

            t_ss->add(std::make_shared<dispatch::detail::Dynamic_Object_Constructor>(
                          class_name,
                          dispatch::make_dynamic_proxy_function(
                              [engine, t_param_names, node = m_body_node](const Function_Params &t_params) {
                                return chaiscript::eval::detail::eval_function(engine, *node, t_param_names, t_params);
                              },
                              static_cast<int>(numparams),
                              m_body_node,
                              param_types,
                              guard)),
                      function_name);

          } else {
            // if the type is unknown, then this generates a function that looks up the type
            // at runtime. Defining the type first before this is called is better
            auto type = t_ss->get_type(class_name, false);
            param_types.push_front(class_name, type);

            t_ss->add(std::make_shared<dispatch::detail::Dynamic_Object_Function>(
                          class_name,
                          dispatch::make_dynamic_proxy_function(
                              [engine, t_param_names, node = m_body_node](const Function_Params &t_params) {
                                return chaiscript::eval::detail::eval_function(engine, *node, t_param_names, t_params);
                              },
                              static_cast<int>(numparams),
                              m_body_node,
                              param_types,
                              guard),
                          type),
                      function_name);
          }
        } catch (const exception::name_conflict_error &e) {
          throw exception::eval_error("Method redefined '" + e.name() + "'");
        }
        return void_var();
      }